

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::Distance> *
metaf::Distance::fromMileString
          (optional<metaf::Distance> *__return_storage_ptr__,string *s,bool remarkFormat)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  size_type sVar4;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Modifier MVar12;
  bool bVar13;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar14;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::
                                   unitStr_abi_cxx11_), iVar8 != 0)) {
    fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_._M_dataplus._M_p =
         (pointer)&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,"SM",
               "");
    __cxa_atexit(std::__cxx11::string::~string,
                 &fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_);
  }
  if (fromMileString(std::__cxx11::string_const&,bool)::unitLength == '\0') {
    fromMileString();
  }
  if (remarkFormat) {
    if (s->_M_string_length == 0) goto LAB_001a9458;
  }
  else {
    if (s->_M_string_length < fromMileString::unitLength + 1) goto LAB_001a9458;
    iVar8 = std::__cxx11::string::compare((char *)s);
    if (iVar8 == 0) {
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = (_Optional_payload_base<unsigned_int>)0x0;
      goto LAB_001a94b9;
    }
    std::__cxx11::string::substr((ulong)&local_48,(ulong)s);
    bVar13 = true;
    if (local_40 ==
        fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_._M_string_length) {
      if (local_40 == 0) {
        bVar13 = false;
      }
      else {
        iVar8 = bcmp(local_48,fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_.
                              _M_dataplus._M_p,local_40);
        bVar13 = iVar8 != 0;
      }
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if (bVar13) goto LAB_001a9458;
  }
  cVar1 = *(s->_M_dataplus)._M_p;
  bVar13 = true;
  if (cVar1 == 'M') {
    MVar12 = LESS_THAN;
  }
  else if (cVar1 == 'P') {
    MVar12 = MORE_THAN;
  }
  else {
    MVar12 = NONE;
    bVar13 = false;
  }
  if (!bVar13) {
    MVar12 = NONE;
  }
  lVar3 = std::__cxx11::string::find((char)s,0x2f);
  if (lVar3 == -1) {
    uVar6 = (ulong)bVar13;
    uVar11 = s->_M_string_length;
    sVar4 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar4 = 0;
    }
    uVar7 = uVar11 - (sVar4 + uVar6);
    if (uVar7 == 0 || 2 < uVar7) goto LAB_001a9458;
    uVar10 = 0;
    if ((uVar11 != 0) && (uVar7 + uVar6 <= uVar11)) {
      uVar9 = 0;
      uVar11 = 0;
      uVar2 = 0;
      do {
        cVar1 = (s->_M_dataplus)._M_p[uVar11 + uVar6];
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          uVar6 = 0;
          goto LAB_001a9477;
        }
        uVar2 = (uint)(byte)(cVar1 - 0x30) + uVar2 * 10;
        uVar11 = uVar11 + 1;
      } while ((uVar11 & 0xffffffff) < uVar7);
      uVar6 = 0x100000000;
      uVar9 = uVar2;
LAB_001a9477:
      uVar10 = uVar9 | uVar6;
    }
    uVar2 = (uint)uVar6;
    if ((uVar10 & 0x100000000) == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
      *(undefined4 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
      uVar11 = 0;
    }
    else {
      uVar2 = (int)uVar10 * 10000;
      uVar11 = 0x100000000;
    }
    if ((uVar10 & 0x100000000) == 0) {
      return __return_storage_ptr__;
    }
  }
  else {
    sVar4 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar4 = 0;
    }
    oVar14 = fractionStrToUint(s,(ulong)bVar13,(s->_M_string_length - (ulong)bVar13) - sVar4);
    _Var5 = oVar14.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
            _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
            _M_payload;
    if (((undefined1  [12])
         oVar14.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> &
        (undefined1  [12])0x1) == (undefined1  [12])0x0) {
LAB_001a9458:
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
      *(undefined4 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
      return __return_storage_ptr__;
    }
    uVar6 = (ulong)_Var5 >> 0x20;
    uVar2 = oVar14.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
            _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
            _M_payload._0_4_;
    if (uVar6 == 0 || uVar2 == 0) goto LAB_001a9458;
    iVar8 = 0;
    if (oVar14.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._4_4_ <=
        uVar2) {
      _Var5._0_4_ = uVar2 % 10;
      _Var5._M_value.second = 0;
      iVar8 = (uVar2 / 10) * 10000;
    }
    if (_Var5._M_value.first == 0) goto LAB_001a9458;
    uVar11 = 0x100000000;
    uVar2 = (int)((_Var5._M_value.first * 10000) / uVar6) + iVar8;
  }
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = MVar12;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)(uVar2 | uVar11);
LAB_001a94b9:
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit = STATUTE_MILES;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Distance> Distance::fromMileString(const std::string & s, 
	bool remarkFormat)
{
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?SM|////SM");
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?");
	static const std::optional<Distance> error;
	static const auto unitStr = std::string ("SM");
	static const auto unitLength = unitStr.length();

	Distance distance;
	distance.distUnit = Unit::STATUTE_MILES;
	if (!remarkFormat) {
		if (s.length() < unitLength + 1) return error; //1 digit minimum
		if (s == "////SM") return distance;
		if (s.substr(s.length() - unitLength, unitLength) != unitStr) return error; //s.endsWith(unitStr)
	} else {
		if (s.length() < 1) return error; //1 digit minimum
	}
	const auto modifier = modifierFromChar(s[0]);
	if (modifier.has_value()) {
		distance.distModifier = *modifier;
	}

	if (s.find('/') == std::string::npos) {
		//The value is integer, e.g. 3SM or 15SM
		const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t intLength = s.length() -
			(remarkFormat ? 0 : unitLength) -
            intPos;
		static const int minDigits = 1, maxDigits = 2;
		if (intLength < minDigits || intLength > maxDigits) return error;
		const auto dist = strToUint(s, intPos, intLength);
		if (!dist.has_value()) return error;
		distance.dist = *dist * statuteMileFactor;
	} else {
		//Fraction value, e.g. 1/2SM, 11/2SM, 5/16SM, 11/16SM
        const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t fracLength = s.length() -
			(remarkFormat ? 0: unitLength) -
			intPos;
		const auto fraction = fractionStrToUint(s,
                                                intPos,
                                                fracLength);
		if (!fraction.has_value()) return error;
		auto integer = 0u;
		auto numerator = std::get<0>(*fraction);
		auto denominator = std::get<1>(*fraction);
		if (!numerator || !denominator) return error;
		if (numerator >= denominator) { //e.g. 11/2SM = 1 1/2SM
			static const auto decimalRadix = 10u;
			integer = numerator / decimalRadix;
			numerator = numerator % decimalRadix;
		}
		if (!numerator) return error;
		distance.dist = 
			integer * statuteMileFactor + 
			numerator * statuteMileFactor / denominator;
	}
	return distance;
}